

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  BrotliBitReader *br;
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  byte *pbVar5;
  uint32_t uVar6;
  int iVar7;
  HuffmanCode *pHVar8;
  uint32_t uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint64_t uVar14;
  uint uVar15;
  HuffmanCode *table;
  bool bVar16;
  uint32_t block_type;
  uint32_t index;
  uint local_50;
  uint local_4c;
  size_t local_48;
  uint8_t *local_40;
  uint64_t local_38;
  
  uVar12 = (ulong)(uint)position;
  uVar3 = s->num_block_types[1];
  if (uVar3 < 2) {
    return 0;
  }
  br = &s->br;
  local_38 = (s->br).val_;
  uVar4 = (s->br).bit_pos_;
  local_40 = (s->br).next_in;
  local_48 = (s->br).avail_in;
  bVar16 = uVar4 - 0x32 < 0xf;
  uVar9 = uVar4;
  if (bVar16) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar14 = (s->br).val_;
      pbVar5 = (s->br).next_in;
      uVar6 = uVar4;
      do {
        uVar9 = uVar6 - 8;
        sVar11 = sVar11 - 1;
        uVar12 = uVar14 >> 8;
        (s->br).val_ = uVar12;
        uVar14 = (ulong)*pbVar5 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar5 + 1;
        bVar16 = uVar6 - 0x3a < 0xf;
        if (!bVar16) goto LAB_0010614c;
        pbVar5 = pbVar5 + 1;
        uVar6 = uVar9;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_0010614c:
    uVar12 = (ulong)((uint)(br->val_ >> ((byte)uVar9 & 0x3f)) & 0x7fff);
  }
  puVar13 = (uint32_t *)(s->block_type_trees + 0x278);
  table = s->block_len_trees + 0x18c;
  if (bVar16) {
    iVar7 = SafeDecodeSymbol((HuffmanCode *)puVar13,br,&local_50);
    if (iVar7 == 0) {
      return 0;
    }
  }
  else {
    pHVar8 = (HuffmanCode *)puVar13 + (uVar12 & 0xff);
    bVar2 = pHVar8->bits;
    if (8 < bVar2) {
      puVar13 = &(s->br).bit_pos_;
      *puVar13 = *puVar13 + 8;
      puVar13 = kBitMask;
      pHVar8 = pHVar8 + (((uint)(uVar12 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                        (uint)pHVar8->value);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar8->bits;
    local_50 = (uint)pHVar8->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar9 = (s->br).bit_pos_;
    bVar16 = uVar9 - 0x32 < 0xf;
    if (bVar16) {
      sVar11 = (s->br).avail_in;
      if (sVar11 != 0) {
        uVar14 = (s->br).val_;
        pbVar5 = (s->br).next_in;
        uVar6 = uVar9;
        do {
          uVar9 = uVar6 - 8;
          sVar11 = sVar11 - 1;
          puVar13 = (uint32_t *)(uVar14 >> 8);
          (s->br).val_ = (uint64_t)puVar13;
          uVar14 = (ulong)*pbVar5 << 0x38 | uVar14 >> 8;
          (s->br).val_ = uVar14;
          (s->br).bit_pos_ = uVar9;
          (s->br).avail_in = sVar11;
          (s->br).next_in = pbVar5 + 1;
          bVar16 = uVar6 - 0x3a < 0xf;
          if (!bVar16) goto LAB_0010622d;
          pbVar5 = pbVar5 + 1;
          uVar6 = uVar9;
        } while (sVar11 != 0);
      }
    }
    else {
LAB_0010622d:
      puVar13 = (uint32_t *)(ulong)((uint)(br->val_ >> ((byte)uVar9 & 0x3f)) & 0x7fff);
    }
    if (bVar16) {
      iVar7 = SafeDecodeSymbol(table,br,&local_4c);
      if (iVar7 == 0) goto LAB_00106351;
    }
    else {
      pHVar8 = table + ((ulong)puVar13 & 0xff);
      bVar2 = pHVar8->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar8 = pHVar8 + (((uint)((ulong)puVar13 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                          (uint)pHVar8->value);
      }
      puVar13 = &(s->br).bit_pos_;
      *puVar13 = *puVar13 + (uint)pHVar8->bits;
      local_4c = (uint)pHVar8->value;
    }
  }
  else {
    local_4c = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_4c].nbits;
  uVar9 = (s->br).bit_pos_;
  bVar16 = 0x40 - uVar9 < (uint)bVar2;
  if (bVar16) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar14 = (s->br).val_;
      uVar15 = 0x48 - uVar9;
      pbVar5 = (s->br).next_in;
      do {
        uVar9 = uVar9 - 8;
        sVar11 = sVar11 - 1;
        (s->br).val_ = uVar14 >> 8;
        uVar14 = (ulong)*pbVar5 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar5 + 1;
        bVar16 = uVar15 < bVar2;
        if (!bVar16) goto LAB_00106308;
        uVar15 = uVar15 + 8;
        pbVar5 = pbVar5 + 1;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_00106308:
    table = (HuffmanCode *)
            (ulong)((uint)((s->br).val_ >> ((byte)uVar9 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar9 + bVar2;
  }
  if (!bVar16) {
    s->block_length[1] = (int)table + (uint)kBlockLengthPrefixCode[local_4c].offset;
  }
  else {
    s->block_length_index = local_4c;
  }
  s->substate_read_block_length = (uint)bVar16;
  if (!bVar16) {
    if (local_50 == 0) {
      local_50 = s->block_type_rb[2];
    }
    else if (local_50 == 1) {
      local_50 = s->block_type_rb[3] + 1;
    }
    else {
      local_50 = local_50 - 2;
    }
    if (uVar3 <= local_50) {
      local_50 = local_50 - uVar3;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = local_50;
    s->htree_command = (s->insert_copy_hgroup).htrees[local_50];
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_lengths_begin != 0) {
        sVar11 = (s->insert_copy_length_block_splits).num_blocks;
        (s->insert_copy_length_block_splits).positions_end[sVar11] = position;
        (s->insert_copy_length_block_splits).num_blocks = sVar11 + 1;
      }
      sVar11 = (s->insert_copy_length_block_splits).num_blocks;
      (s->insert_copy_length_block_splits).positions_begin[sVar11] = position;
      (s->insert_copy_length_block_splits).types[sVar11] =
           (char)(int)(s->insert_copy_length_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[3];
      uVar12 = (s->insert_copy_length_block_splits).num_types;
      uVar10 = (ulong)(s->insert_copy_length_block_splits).types
                      [(s->insert_copy_length_block_splits).num_blocks] + 1;
      if (uVar10 < uVar12) {
        uVar10 = uVar12;
      }
      (s->insert_copy_length_block_splits).num_types = uVar10;
      return 1;
    }
    return 1;
  }
LAB_00106351:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = local_38;
  (s->br).bit_pos_ = uVar4;
  (s->br).next_in = local_40;
  (s->br).avail_in = local_48;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}